

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,LargestUInt value)

{
  allocator local_41;
  char *current;
  UIntToStringBuffer buffer;
  char local_1f [15];
  
  current = local_1f;
  uintToString((LargestUInt)this,&current);
  if (buffer <= current) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,current,&local_41);
    return __return_storage_ptr__;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0x5a,"std::string Json::valueToString(LargestUInt)");
}

Assistant:

std::string valueToString(LargestUInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  uintToString(value, current);
  assert(current >= buffer);
  return current;
}